

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O0

int pconv(lua_State *L)

{
  char *s;
  char *error;
  size_t sz;
  lua_State *plStack_20;
  int ret;
  lua_State *pL;
  context *ctx;
  lua_State *L_local;
  
  ctx = (context *)L;
  pL = (lua_State *)lua_touserdata(L,1);
  plStack_20 = (lua_State *)lua_touserdata((lua_State *)ctx,2);
  lua_settop((lua_State *)ctx,0);
  lua_createtable((lua_State *)ctx,0,0);
  lua_pushcclosure(plStack_20,convtable,0);
  lua_pushvalue(plStack_20,1);
  lua_pushlightuserdata(plStack_20,pL);
  sz._4_4_ = lua_pcallk(plStack_20,2,0,0,0,(lua_KFunction)0x0);
  if (sz._4_4_ != 0) {
    error = (char *)0x0;
    s = lua_tolstring(plStack_20,-1,(size_t *)&error);
    lua_pushlstring((lua_State *)ctx,s,(size_t)error);
    lua_error((lua_State *)ctx);
  }
  luaL_checkstack((lua_State *)ctx,*(int *)&pL->top + 3,(char *)0x0);
  lua_settop((lua_State *)ctx,1);
  return 1;
}

Assistant:

static int
pconv(lua_State *L) {
	struct context *ctx = lua_touserdata(L,1);
	lua_State * pL = lua_touserdata(L, 2);
	int ret;

	lua_settop(L, 0);

	// init L (may throw memory error)
	// create a table for string map
	lua_newtable(L);

	lua_pushcfunction(pL, convtable);
	lua_pushvalue(pL,1);
	lua_pushlightuserdata(pL, ctx);

	ret = lua_pcall(pL, 2, 0, 0);
	if (ret != LUA_OK) {
		size_t sz = 0;
		const char * error = lua_tolstring(pL, -1, &sz);
		lua_pushlstring(L, error, sz);
		lua_error(L);
		// never get here
	}

	luaL_checkstack(L, ctx->string_index + 3, NULL);
	lua_settop(L,1);

	return 1;
}